

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void __thiscall QScrollerPrivate::setState(QScrollerPrivate *this,State newstate)

{
  long lVar1;
  long *plVar2;
  char *pcVar3;
  State SVar4;
  long lVar5;
  qreal qVar6;
  int *piVar7;
  QDebug QVar8;
  Type *c;
  QPodArrayOps<QScroller*> *this_00;
  char *pcVar9;
  long lVar10;
  storage_type *psVar11;
  QScrollerPrivate *this_01;
  QScrollerPrivate *pQVar12;
  QScroller *pQVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QScroller *q;
  undefined1 auStack_a8 [8];
  QDebug local_a0;
  QScroller *local_98;
  State local_90;
  undefined4 uStack_8c;
  undefined1 local_78 [8];
  State *pSStack_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  _func_int **pp_Stack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  qreal local_38;
  
  pQVar12 = (QScrollerPrivate *)auStack_a8;
  local_38 = *(qreal *)(in_FS_OFFSET + 0x28);
  local_98 = this->q_ptr;
  if (this->state == newstate) goto LAB_00652eab;
  this_01 = this;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78._0_4_ = TapAndHoldGesture;
    local_78._4_4_ = 0;
    pSStack_70 = (State *)0x0;
    uStack_68 = 0;
    uStack_64 = 0;
    pp_Stack_60 = (_func_int **)lcScroller::category.name;
    QMessageLogger::debug();
    ::operator<<((Stream *)&local_a0,(QObject *)auStack_a8);
    QVar8.stream = local_a0.stream;
    QVar14.m_data = (storage_type *)0x14;
    QVar14.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_90);
    piVar7 = (int *)CONCAT44(uStack_8c,local_90);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_8c,local_90),2,0x10);
      }
    }
    if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
    }
    QVar8.stream = local_a0.stream;
    if (newstate < 4) {
      pcVar9 = *(char **)(&DAT_00815ce8 + (ulong)newstate * 8);
    }
    else {
      pcVar9 = "(invalid)";
    }
    psVar11 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar3 = psVar11 + (long)(pcVar9 + 1);
      psVar11 = psVar11 + 1;
    } while (*pcVar3 != '\0');
    QVar15.m_data = psVar11;
    QVar15.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_90);
    piVar7 = (int *)CONCAT44(uStack_8c,local_90);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_8c,local_90),2,0x10);
      }
    }
    if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_a0.stream,')');
    if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
    }
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug((QDebug *)auStack_a8);
    this_01 = pQVar12;
  }
  switch((ulong)newstate) {
  case 0:
    this_01 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    this->state = Inactive;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
    if (this->firstScroll == false) {
      this_01 = (QScrollerPrivate *)local_78;
      local_78._0_4_ = 0xaaaaaaaa;
      local_78._4_4_ = 0xaaaaaaaa;
      pSStack_70 = (State *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_68 = 0xffffffff;
      uStack_64 = 0xffffffff;
      pp_Stack_60 = (_func_int **)0xffffffffffffffff;
      local_58 = 0xffffffff;
      uStack_54 = 0xffffffff;
      uStack_50 = 0xffffffff;
      uStack_4c = 0xffffffff;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QScrollEvent::QScrollEvent
                ((QScrollEvent *)this_01,&this->contentPosition,&this->overshootPosition,
                 ScrollFinished);
      qt_sendSpontaneousEvent(this->target,(QEvent *)this_01);
      this->firstScroll = true;
      QScrollEvent::~QScrollEvent((QScrollEvent *)this_01);
    }
    break;
  case 1:
    this_01 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    qVar6 = (this->releaseVelocity).yp;
    (this->oldVelocity).xp = (this->releaseVelocity).xp;
    (this->oldVelocity).yp = qVar6;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
  default:
    this->state = newstate;
    break;
  case 2:
    (this->dragDistance).xp = 0.0;
    (this->dragDistance).yp = 0.0;
    SVar4 = this->state;
    this->state = Dragging;
    if (SVar4 == Pressed) goto LAB_00652db9;
    break;
  case 3:
    this->state = Scrolling;
LAB_00652db9:
    pQVar12 = (QScrollerPrivate *)this->scrollTimer;
    this_01 = pQVar12;
    QAbstractAnimation::start((DeletionPolicy)pQVar12);
    *(undefined4 *)&(pQVar12->properties)._vptr_QScrollerProperties = 0;
  }
  SVar4 = this->state;
  c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                  *)this_01);
  pQVar13 = local_98;
  if ((SVar4 & ~Pressed) == Dragging) {
    lVar5 = (c->d).size;
    if (lVar5 != 0) {
      lVar10 = 0;
      do {
        if (lVar5 << 3 == lVar10) goto LAB_00652e44;
        lVar1 = lVar10 + 8;
        plVar2 = (long *)((long)(c->d).ptr + lVar10);
        lVar10 = lVar1;
      } while ((QScroller *)*plVar2 != local_98);
      if (lVar1 != 0) goto LAB_00652e7d;
    }
LAB_00652e44:
    this_00 = (QPodArrayOps<QScroller*> *)
              QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
              ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                            *)this_01);
    local_78._0_4_ = SUB84(pQVar13,0);
    local_78._4_4_ = (undefined4)((ulong)pQVar13 >> 0x20);
    QtPrivate::QPodArrayOps<QScroller*>::emplace<QScroller*&>
              (this_00,*(qsizetype *)(this_00 + 0x10),(QScroller **)local_78);
    QList<QScroller_*>::end((QList<QScroller_*> *)this_00);
  }
  else {
    QtPrivate::sequential_erase_one<QList<QScroller*>,QScroller*>(c,&local_98);
    pQVar13 = local_98;
  }
LAB_00652e7d:
  local_90 = this->state;
  pSStack_70 = &local_90;
  local_78._0_4_ = ~LastGestureType;
  local_78._4_4_ = 0;
  QMetaObject::activate(&pQVar13->super_QObject,&QScroller::staticMetaObject,0,(void **)local_78);
LAB_00652eab:
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::setState(QScroller::State newstate)
{
    Q_Q(QScroller);
    bool sendLastScroll = false;
    bool startTimer = false;

    if (state == newstate)
        return;

    qCDebug(lcScroller) << q << "QScroller::setState(" << stateName(newstate) << ')';

    switch (newstate) {
    case QScroller::Inactive:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        // send the last scroll event (but only after the current state change was finished)
        if (!firstScroll)
            sendLastScroll = true;

        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Pressed:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        oldVelocity = releaseVelocity;
        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Dragging:
        dragDistance = QPointF(0, 0);
#if QT_CONFIG(animation)
        if (state == QScroller::Pressed)
            startTimer = true;
#endif
        break;

    case QScroller::Scrolling:
#if QT_CONFIG(animation)
        startTimer = true;
#endif
        break;
    }

    qSwap(state, newstate);

#if QT_CONFIG(animation)
    // Only start the timer after the state has been changed
    if (startTimer)
        scrollTimer->start();
#endif
    if (sendLastScroll) {
        QScrollEvent se(contentPosition, overshootPosition, QScrollEvent::ScrollFinished);
        sendEvent(target, &se);
        firstScroll = true;
    }
    if (state == QScroller::Dragging || state == QScroller::Scrolling) {
        if (!qt_activeScrollers()->contains(q))
            qt_activeScrollers()->push_back(q);
    } else {
        qt_activeScrollers()->removeOne(q);
    }
    emit q->stateChanged(state);
}